

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.c
# Opt level: O0

void testAdjMatrixGraph(void)

{
  char cVar1;
  char cVar2;
  long lVar3;
  MatrixGraph pAVar4;
  uint uVar5;
  int *D;
  int_0_ *D_00;
  int_0_ *P;
  undefined8 uStack_b0;
  ulong local_a8;
  int_0_ *local_a0;
  ulong local_98;
  int_0_ *local_90;
  char *local_88;
  int local_80;
  undefined1 local_79;
  int *local_78;
  int local_70;
  int local_6c;
  int j_1;
  int i_2;
  int j;
  int i_1;
  unsigned_long __vla_expr4;
  unsigned_long __vla_expr3;
  unsigned_long __vla_expr2;
  unsigned_long __vla_expr1;
  int i;
  int V0;
  unsigned_long __vla_expr0;
  MatrixGraph local_28;
  MatrixGraph matrix;
  Edges edge;
  Vertices vertex;
  int VERTEX_SIZE;
  
  local_88 = "*****************************************************\n";
  local_79 = 0;
  uStack_b0 = 0x10bf50;
  printf("*****************************************************\n");
  uStack_b0 = 0x10bf5f;
  printf(anon_var_dwarf_56d8);
  uStack_b0 = 0x10bf6b;
  printf(local_88);
  vertex._4_4_ = 5;
  local_80 = 5;
  uStack_b0 = 0x10bf7f;
  edge = (Edges)newVexTestCase(5);
  uStack_b0 = 0x10bf8b;
  matrix = (MatrixGraph)newEdgeTestCase(local_80);
  uStack_b0 = 0x10bfa7;
  local_28 = createAdjacencyMatrix((Vertices)edge,(Edges)matrix,local_80,local_80,DN);
  uStack_b0 = 0x10bfb4;
  showMatrixGraph_AMG(local_28);
  uStack_b0 = 0x10bfc0;
  matrix = (MatrixGraph)reAllocEdge(local_80,(Edges)matrix);
  uStack_b0 = 0x10bfd6;
  newEdgeForGraphVertex_AMG(local_28,(Edges)matrix,7);
  uStack_b0 = 0x10bfdf;
  showMatrixGraph_AMG(local_28);
  uStack_b0 = 0x10bfee;
  printf(anon_var_dwarf_56ee);
  uStack_b0 = 0x10bff7;
  dfsTraversal_AMG(local_28);
  uStack_b0 = 0x10c006;
  printf(anon_var_dwarf_5704);
  uStack_b0 = 0x10c00f;
  bfsTraversal_AMG(local_28);
  uStack_b0 = 0x10c018;
  uVar5 = numOfConnectedComponents_AMG(local_28);
  uStack_b0 = 0x10c029;
  printf(anon_var_dwarf_570e,(ulong)uVar5);
  uStack_b0 = 0x10c038;
  printf(anon_var_dwarf_5724);
  uStack_b0 = 0x10c041;
  miniSpanTree_Prim(local_28);
  uStack_b0 = 0x10c050;
  printf(anon_var_dwarf_573a);
  uStack_b0 = 0x10c059;
  miniSpanTree_Kruskal(local_28);
  uStack_b0 = 0x10c068;
  printf(anon_var_dwarf_5750);
  pAVar4 = local_28;
  _i = (ulong)(uint)local_28->vexNum;
  lVar3 = -(_i * 4 + 0xf & 0xfffffffffffffff0);
  D = (int *)((long)&local_a8 + lVar3);
  __vla_expr1._4_4_ = 0;
  local_78 = D;
  __vla_expr0 = (unsigned_long)&local_a8;
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10c0a6;
  shortPath_Dijkstra(pAVar4,0,D);
  for (__vla_expr1._0_4_ = 0; (int)__vla_expr1 < local_28->vexNum;
      __vla_expr1._0_4_ = (int)__vla_expr1 + 1) {
    cVar1 = local_28->vertex[__vla_expr1._4_4_];
    cVar2 = local_28->vertex[(int)__vla_expr1];
    uVar5 = local_78[(int)__vla_expr1];
    *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10c0f0;
    printf("%c -> %c : %d\n",(ulong)(uint)(int)cVar1,(ulong)(uint)(int)cVar2,(ulong)uVar5);
  }
  *(undefined8 *)((long)&uStack_b0 + lVar3) = 0x10c109;
  printf(anon_var_dwarf_577c);
  pAVar4 = local_28;
  local_a8 = (ulong)(uint)local_28->vexNum;
  P = (int_0_ *)((long)D - (local_a8 * local_a8 * 4 + 0xf & 0xfffffffffffffff0));
  local_98 = (ulong)(uint)local_28->vexNum;
  D_00 = P + -(local_98 * local_98 * 4 + 0xf & 0xfffffffffffffff0);
  local_a0 = P;
  local_90 = D_00;
  _j = local_98;
  __vla_expr4 = local_98;
  __vla_expr3 = local_a8;
  __vla_expr2 = local_a8;
  *(undefined8 *)(D_00 + -8) = 0x10c189;
  shortestPath_Floyd(pAVar4,P,D_00);
  *(undefined8 *)(D_00 + -8) = 0x10c197;
  printf(anon_var_dwarf_5792);
  for (i_2 = 0; i_2 < local_28->vexNum; i_2 = i_2 + 1) {
    for (j_1 = 0; j_1 < local_28->vexNum; j_1 = j_1 + 1) {
      if (*(int *)(local_90 + (long)j_1 * 4 + (long)i_2 * local_98 * 4) == 0x7fff) {
        *(undefined8 *)(D_00 + -8) = 0x10c1f9;
        printf(anon_var_dwarf_57a8);
      }
      else {
        uVar5 = *(uint *)(local_90 + (long)j_1 * 4 + (long)i_2 * local_98 * 4);
        *(undefined8 *)(D_00 + -8) = 0x10c22d;
        printf("%d\t",(ulong)uVar5);
      }
    }
    *(undefined8 *)(D_00 + -8) = 0x10c24b;
    printf(anon_var_dwarf_426b + 0x43);
  }
  *(undefined8 *)(D_00 + -8) = 0x10c267;
  printf(anon_var_dwarf_57ea);
  for (local_6c = 0; local_6c < local_28->vexNum; local_6c = local_6c + 1) {
    for (local_70 = 0; local_70 < local_28->vexNum; local_70 = local_70 + 1) {
      uVar5 = *(uint *)(local_a0 + (long)local_70 * 4 + (long)local_6c * local_a8 * 4);
      *(undefined8 *)(D_00 + -8) = 0x10c2bf;
      printf("%d\t",(ulong)uVar5);
    }
    *(undefined8 *)(D_00 + -8) = 0x10c2d8;
    printf(anon_var_dwarf_426b + 0x43);
  }
  *(undefined8 *)(D_00 + -8) = 0x10c2ef;
  puts(anon_var_dwarf_426b + 0x43);
  return;
}

Assistant:

void testAdjMatrixGraph() {
    printf("*****************************************************\n");
    printf("*              邻接矩阵存储结构图测试例程              *\n");
    printf("*****************************************************\n");

    const int VERTEX_SIZE = 5;
    Vertices vertex = newVexTestCase(VERTEX_SIZE);

    // [a, b, c, d, e]
    Edges edge = newEdgeTestCase(VERTEX_SIZE);

    MatrixGraph matrix = createAdjacencyMatrix(vertex, edge, VERTEX_SIZE, VERTEX_SIZE, DN);
    showMatrixGraph_AMG(matrix);

    edge = reAllocEdge(VERTEX_SIZE, edge);

    newEdgeForGraphVertex_AMG(matrix, edge, VERTEX_SIZE + 2);
    showMatrixGraph_AMG(matrix);

    printf("深度优先遍历的结果：\n");
    dfsTraversal_AMG(matrix);

    printf("广度优先遍历的结果：\n");
    bfsTraversal_AMG(matrix);

    printf("连通分量的个数为：%d\n", numOfConnectedComponents_AMG(matrix));

    printf("Prime的算法计算最小生成树：\n");
    miniSpanTree_Prim(matrix);

    printf("Kruskal的算法计算最小生成树：\n");
    miniSpanTree_Kruskal(matrix);

    printf("Dijkstra算法计算最短路径：\n");
    int D[matrix->vexNum], V0 = 0;
    shortPath_Dijkstra(matrix, V0, D);
    for (int i = 0; i < matrix->vexNum; ++i)
        printf("%c -> %c : %d\n", matrix->vertex[V0], matrix->vertex[i], D[i]);

    printf("Floyd算法计算最短路径：\n");
    int P[matrix->vexNum][matrix->vexNum];
    int D_f[matrix->vexNum][matrix->vexNum];
    shortestPath_Floyd(matrix, P, D_f);
    printf("矩阵D：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            if (D_f[i][j] == UNFLAG_WEIGHT_GRAPH)
                printf("∞\t");
            else
                printf("%d\t", D_f[i][j]);
        printf("\n");
    }

    printf("矩阵P：\n");
    for (int i = 0; i < matrix->vexNum; ++i) {
        for (int j = 0; j < matrix->vexNum; ++j)
            printf("%d\t", P[i][j]);
        printf("\n");
    }
    puts("\n");
}